

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O1

void __thiscall
CVmObjStrCompMapReaderList::read_mapping
          (CVmObjStrCompMapReaderList *this,wchar_t *ref_ch,unsigned_long *uc_result_flags,
          unsigned_long *lc_result_flags,wchar_t *val_buf,size_t *value_ch_cnt)

{
  int iVar1;
  wchar_t wVar2;
  short *psVar3;
  ushort *puVar4;
  ushort *puVar5;
  size_t sVar6;
  byte *pbVar7;
  vm_val_t sublst;
  vm_val_t val;
  vm_val_t local_80;
  vm_val_t local_70;
  CVmObjStrCompMapReaderList *local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  wchar_t *local_48;
  vm_val_t local_40;
  
  sVar6 = *value_ch_cnt;
  local_70.val.obj = (vm_obj_id_t)this->idx_;
  local_70.typ = VM_INT;
  local_60 = this;
  local_58 = lc_result_flags;
  local_50 = uc_result_flags;
  local_48 = ref_ch;
  vm_val_t::ll_index(this->lst_,&local_80,&local_70);
  iVar1 = vm_val_t::is_listlike(&local_80);
  if (iVar1 != 0) {
    iVar1 = vm_val_t::ll_length(&local_80);
    if (-1 < iVar1) {
      local_70.typ = VM_INT;
      local_70.val.obj = 1;
      vm_val_t::ll_index(&local_80,&local_40,&local_70);
      psVar3 = (short *)vm_val_t::get_as_string(&local_40);
      local_70.typ = VM_INT;
      local_70.val.obj = 2;
      vm_val_t::ll_index(&local_80,&local_40,&local_70);
      puVar4 = (ushort *)vm_val_t::get_as_string(&local_40);
      if ((psVar3 != (short *)0x0) && (puVar4 != (ushort *)0x0)) {
        if ((*psVar3 == 0) || (*puVar4 == 0)) {
          err_throw(0x902);
        }
        wVar2 = utf8_ptr::s_getch((char *)(psVar3 + 1));
        *local_48 = wVar2;
        pbVar7 = (byte *)(ulong)*puVar4;
        *value_ch_cnt = 0;
        if (pbVar7 != (byte *)0x0) {
          puVar4 = puVar4 + 1;
          do {
            if (sVar6 == 0) {
              sVar6 = 0;
            }
            else {
              wVar2 = utf8_ptr::s_getch((char *)puVar4);
              *val_buf = wVar2;
              val_buf = val_buf + 1;
              sVar6 = sVar6 - 1;
            }
            *value_ch_cnt = *value_ch_cnt + 1;
            puVar5 = (ushort *)
                     ((long)puVar4 +
                     (ulong)((((byte)*puVar4 >> 5 & 1) != 0) + 1 &
                            (uint)(byte)((byte)*puVar4 >> 7) * 3) + 1);
            pbVar7 = (byte *)((long)puVar4 + ((long)pbVar7 - (long)puVar5));
            puVar4 = puVar5;
          } while (pbVar7 != (byte *)0x0);
        }
        local_70.typ = VM_INT;
        local_70.val.obj = 3;
        vm_val_t::ll_index(&local_80,&local_40,&local_70);
        if (local_40.typ == VM_INT) {
          *local_50 = (long)local_40.val.intval;
          local_70.typ = VM_INT;
          local_70.val.obj = 4;
          vm_val_t::ll_index(&local_80,&local_40,&local_70);
          if (local_40.typ == VM_INT) {
            *local_58 = (long)local_40.val.intval;
            local_60->idx_ = local_60->idx_ + 1;
            return;
          }
        }
      }
    }
  }
  err_throw(0x900);
}

Assistant:

virtual void read_mapping(VMG_ wchar_t *ref_ch,
                              unsigned long *uc_result_flags,
                              unsigned long *lc_result_flags,
                              wchar_t *val_buf, size_t *value_ch_cnt)
    {
        vm_val_t val;
        vm_val_t sublst;
        const char *refstr;
        const char *valstr;
        size_t copy_rem;
        size_t rem;
        utf8_ptr p;

        /* note the size limit of the caller's value string buffer */
        copy_rem = *value_ch_cnt;

        /* retrieve the next element of the list */
        lst_->ll_index(vmg_ &sublst, idx_);

        /* get the value as a sublist */
        if (!sublst.is_listlike(vmg0_) || sublst.ll_length(vmg0_) < 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* retrieve the reference character string (sublst's 1st element) */
        sublst.ll_index(vmg_ &val, 1);
        refstr = val.get_as_string(vmg0_);

        /* retrieve the value string (sublst's 2nd element) */
        sublst.ll_index(vmg_ &val, 2);
        valstr = val.get_as_string(vmg0_);

        /* make sure the reference and value strings are indeed strings */
        if (refstr == 0 || valstr == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* we need at least one character in each string */
        if (vmb_get_len(refstr) == 0 || vmb_get_len(valstr) == 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* fill in the caller's reference character from the ref string */
        *ref_ch = utf8_ptr::s_getch(refstr + VMB_LEN);

        /* store the characters of the value string, up to the buffer limit */
        p.set((char *)valstr + VMB_LEN);
        rem = vmb_get_len(valstr);
        for (*value_ch_cnt = 0 ; rem != 0 ; p.inc(&rem))
        {
            /* if we have room, copy this character */
            if (copy_rem != 0)
            {
                /* copy the character */
                *val_buf++ = p.getch();

                /* count it */
                --copy_rem;
            }

            /* count it in the actual length */
            ++(*value_ch_cnt);
        }

        /* get the upper-case flags (sublst's 3rd element) */
        sublst.ll_index(vmg_ &val, 3);
        if (val.typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);
        *uc_result_flags = val.val.intval;

        /* get the lower-case flags (sublst's 4th element) */
        sublst.ll_index(vmg_ &val, 4);
        if (val.typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);
        *lc_result_flags = val.val.intval;

        /* we're done with this mapping, so advance to the next one */
        ++idx_;
    }